

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O0

void __thiscall P2PSocket::createServer(P2PSocket *this,string *ip,uint16_t port)

{
  Socket SVar1;
  int iVar2;
  P2PSocketException *pPVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_162;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_11a;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d2;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Socket local_90;
  undefined1 local_8c [8];
  sockaddr_in address;
  allocator<char> local_41;
  string local_40;
  ushort local_1a;
  string *psStack_18;
  uint16_t port_local;
  string *ip_local;
  P2PSocket *this_local;
  
  local_1a = port;
  psStack_18 = ip;
  ip_local = (string *)this;
  SVar1 = SocketResource::resource(&this->m_socket);
  if (SVar1 != -1) {
    pPVar3 = (P2PSocketException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Socket server was already created\n",&local_41);
    P2PSocketException::P2PSocketException(pPVar3,&local_40);
    __cxa_throw(pPVar3,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  if (local_1a < 1000) {
    address.sin_zero[2] = '\x01';
    pPVar3 = (P2PSocketException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(address.sin_zero + 4),"Invalid port\n",
               (allocator<char> *)(address.sin_zero + 3));
    P2PSocketException::P2PSocketException(pPVar3,(string *)(address.sin_zero + 4));
    address.sin_zero[2] = '\0';
    __cxa_throw(pPVar3,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  memset(local_8c,0,0x10);
  memset(local_8c,0,0x10);
  local_8c._0_2_ = 2;
  local_8c._2_2_ = htons(local_1a);
  local_90 = (Socket)SocketResource::create();
  (this->m_socket).m_socket = local_90;
  SVar1 = SocketResource::resource(&this->m_socket);
  if (SVar1 == -1) {
    local_d2 = 1;
    pPVar3 = (P2PSocketException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Failed to create socket\n",&local_d1);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator+(&local_b0,&local_d0,pcVar5);
    P2PSocketException::P2PSocketException(pPVar3,&local_b0);
    local_d2 = 0;
    __cxa_throw(pPVar3,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar2 = inet_pton(2,pcVar5,local_8c + 4);
    if (iVar2 < 1) {
      local_11a = 1;
      pPVar3 = (P2PSocketException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"Invalid IPv4 host address\n",&local_119);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      std::operator+(&local_f8,&local_118,pcVar5);
      P2PSocketException::P2PSocketException(pPVar3,&local_f8);
      local_11a = 0;
      __cxa_throw(pPVar3,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
    }
  }
  else {
    local_8c[4] = '\0';
    local_8c[5] = '\0';
    local_8c[6] = '\0';
    local_8c[7] = '\0';
  }
  SVar1 = SocketResource::resource(&this->m_socket);
  iVar2 = bind(SVar1,(sockaddr *)local_8c,0x10);
  if (iVar2 == -1) {
    local_162 = 1;
    pPVar3 = (P2PSocketException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"Failed to bind\n",&local_161);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator+(&local_140,&local_160,pcVar5);
    P2PSocketException::P2PSocketException(pPVar3,&local_140);
    local_162 = 0;
    __cxa_throw(pPVar3,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  SVar1 = SocketResource::resource(&this->m_socket);
  iVar2 = ::listen(SVar1,this->m_maxPeers);
  if (iVar2 < 0) {
    pPVar3 = (P2PSocketException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"Failed to start listener",&local_1a9);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator+(&local_188,&local_1a8,pcVar5);
    P2PSocketException::P2PSocketException(pPVar3,&local_188);
    __cxa_throw(pPVar3,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  return;
}

Assistant:

void P2PSocket::createServer(const std::string &ip, uint16_t port)
{
    if (m_socket.resource() != -1) {
        throw P2PSocketException("Socket server was already created\n");
    }

    // validate port
    if (port < 0x3E8 || port > 0xFFFF) {
        throw P2PSocketException("Invalid port\n");
    }

    sockaddr_in address{};
    std::memset(&address, 0, sizeof address);
    address.sin_family = AF_INET;
    address.sin_port = htons(port);

    // save socket resource
    m_socket = SocketResource::create();
    if (m_socket.resource() == -1) {
        throw P2PSocketException(std::string{"Failed to create socket\n"} + std::strerror(errno));
    }

    // validate ip
    if (ip.empty()) {
        address.sin_addr.s_addr = INADDR_ANY;
    } else {
#ifdef _WIN32
        auto addr = ::inet_addr(ip.c_str());
        if (addr == INADDR_NONE)
            throw P2PSocketException("inet_addr failure: returned INADDR_NONE");
        if (addr == INADDR_ANY)
            throw P2PSocketException("inet_addr failure: returned INADDR_ANY");
        address.sin_addr.s_addr = addr;
#else
        if (::inet_pton(AF_INET, ip.c_str(), &address.sin_addr) <= 0)
            throw P2PSocketException(std::string{"Invalid IPv4 host address\n"} +
                                     std::strerror(errno));
#endif
    }

    if (::bind(m_socket.resource(), (struct sockaddr *)&address, sizeof(address)) == -1) {
        throw P2PSocketException(std::string{"Failed to bind\n"} + std::strerror(errno));
    }

    if (::listen(m_socket.resource(), m_maxPeers) < 0) {
        throw P2PSocketException(std::string{"Failed to start listener"} + std::strerror(errno));
    }
}